

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall cmCPackGenerator::InstallProject(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  uint uVar9;
  mode_t *permissions;
  uint uVar10;
  pointer arg;
  mode_t default_dir_mode_v;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string bareTempInstallDirectory;
  string tempInstallDirectoryStr;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Install projects");
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0xaf,bareTempInstallDirectory._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&bareTempInstallDirectory);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  CleanTemporaryDirectory(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_INSTALL_DIRECTORY",
             (allocator<char> *)&tempInstallDirectoryStr);
  pcVar8 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bareTempInstallDirectory,pcVar8,(allocator<char> *)&local_228);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&tempInstallDirectoryStr,(string *)&bareTempInstallDirectory);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_SET_DESTDIR",(allocator<char> *)&items);
  pcVar8 = GetOption(this,(string *)&cmCPackLog_msg);
  bVar3 = cmSystemTools::IsOn(pcVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"CPACK_SET_DESTDIR",(allocator<char> *)&default_dir_mode_v);
  pcVar8 = GetOption(this,&local_228);
  bVar4 = cmSystemTools::IsInternallyOn(pcVar8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (!bVar3 && !bVar4) {
    (*this->_vptr_cmCPackGenerator[0xb])(this);
    std::__cxx11::string::append((char *)&tempInstallDirectoryStr);
  }
  bVar5 = cmsys::SystemTools::MakeDirectory(&bareTempInstallDirectory,(mode_t *)0x0);
  if (bVar5) {
    if (bVar3 || bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"DESTDIR=",(allocator<char> *)&local_228);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      cmsys::SystemTools::PutEnv((string *)&cmCPackLog_msg);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"DESTDIR=",(allocator<char> *)&local_228);
      cmsys::SystemTools::PutEnv((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    default_dir_mode_v = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
               (allocator<char> *)&local_228);
    pcVar8 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
      permissions = (mode_t *)0x0;
    }
    else {
      items.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      items.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      items.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,pcVar8,(allocator<char> *)&local_228);
      cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&items,false);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      pbVar2 = items.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      permissions = &default_dir_mode_v;
      for (arg = items.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; arg != pbVar2; arg = arg + 1) {
        bVar5 = cmFSPermissions::stringToModeT(arg,permissions);
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Invalid permission value \'");
          poVar7 = std::operator<<(poVar7,(string *)arg);
          poVar7 = std::operator<<(poVar7,
                                   "\'. CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS value is invalid."
                                  );
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0xde,local_228._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&items);
          goto LAB_0013f45e;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&items);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,tempInstallDirectoryStr._M_dataplus._M_p,
               (allocator<char> *)&local_228);
    uVar9 = (uint)(bVar3 || bVar4);
    iVar6 = (*this->_vptr_cmCPackGenerator[0x10])(this,(ulong)uVar9,&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    uVar10 = 0;
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,tempInstallDirectoryStr._M_dataplus._M_p,
                 (allocator<char> *)&local_228);
      iVar6 = (*this->_vptr_cmCPackGenerator[0x11])(this,(ulong)uVar9,&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (iVar6 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,tempInstallDirectoryStr._M_dataplus._M_p,
                   (allocator<char> *)&local_228);
        uVar9 = (uint)(bVar3 || bVar4);
        iVar6 = (*this->_vptr_cmCPackGenerator[0x12])(this,(ulong)uVar9,&cmCPackLog_msg,permissions)
        ;
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        uVar10 = 0;
        if (iVar6 != 0) {
          iVar6 = (*this->_vptr_cmCPackGenerator[0x13])
                            (this,(ulong)uVar9,&bareTempInstallDirectory,permissions);
          if ((bVar3 || bVar4) && iVar6 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cmCPackLog_msg,"DESTDIR=",(allocator<char> *)&local_228);
            cmsys::SystemTools::PutEnv((string *)&cmCPackLog_msg);
            std::__cxx11::string::~string((string *)&cmCPackLog_msg);
            uVar10 = 1;
          }
          else {
            uVar10 = (uint)(iVar6 != 0);
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem creating temporary directory: ");
    pcVar8 = "(NULL)";
    if (tempInstallDirectoryStr._M_dataplus._M_p != (pointer)0x0) {
      pcVar8 = tempInstallDirectoryStr._M_dataplus._M_p;
    }
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0xc1,local_228._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_0013f45e:
    uVar10 = 0;
  }
  std::__cxx11::string::~string((string *)&tempInstallDirectoryStr);
  std::__cxx11::string::~string((string *)&bareTempInstallDirectory);
  return uVar10;
}

Assistant:

int cmCPackGenerator::InstallProject()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Install projects" << std::endl);
  this->CleanTemporaryDirectory();

  std::string bareTempInstallDirectory =
    this->GetOption("CPACK_TEMPORARY_INSTALL_DIRECTORY");
  std::string tempInstallDirectoryStr = bareTempInstallDirectory;
  bool setDestDir = cmSystemTools::IsOn(this->GetOption("CPACK_SET_DESTDIR")) |
    cmSystemTools::IsInternallyOn(this->GetOption("CPACK_SET_DESTDIR"));
  if (!setDestDir) {
    tempInstallDirectoryStr += this->GetPackagingInstallPrefix();
  }

  const char* tempInstallDirectory = tempInstallDirectoryStr.c_str();
  int res = 1;
  if (!cmsys::SystemTools::MakeDirectory(bareTempInstallDirectory)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem creating temporary directory: "
                    << (tempInstallDirectory ? tempInstallDirectory : "(NULL)")
                    << std::endl);
    return 0;
  }

  if (setDestDir) {
    std::string destDir = "DESTDIR=";
    destDir += tempInstallDirectory;
    cmSystemTools::PutEnv(destDir);
  } else {
    // Make sure there is no destdir
    cmSystemTools::PutEnv("DESTDIR=");
  }

  // prepare default created directory permissions
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = nullptr;
  const char* default_dir_install_permissions =
    this->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (default_dir_install_permissions && *default_dir_install_permissions) {
    std::vector<std::string> items;
    cmSystemTools::ExpandListArgument(default_dir_install_permissions, items);
    for (const auto& arg : items) {
      if (!cmFSPermissions::stringToModeT(arg, default_dir_mode_v)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Invalid permission value '"
                        << arg
                        << "'."
                           " CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS "
                           "value is invalid."
                        << std::endl);
        return 0;
      }
    }

    default_dir_mode = &default_dir_mode_v;
  }

  // If the CPackConfig file sets CPACK_INSTALL_COMMANDS then run them
  // as listed
  if (!this->InstallProjectViaInstallCommands(setDestDir,
                                              tempInstallDirectory)) {
    return 0;
  }

  // If the CPackConfig file sets CPACK_INSTALL_SCRIPT then run them
  // as listed
  if (!this->InstallProjectViaInstallScript(setDestDir,
                                            tempInstallDirectory)) {
    return 0;
  }

  // If the CPackConfig file sets CPACK_INSTALLED_DIRECTORIES
  // then glob it and copy it to CPACK_TEMPORARY_DIRECTORY
  // This is used in Source packaging
  if (!this->InstallProjectViaInstalledDirectories(
        setDestDir, tempInstallDirectory, default_dir_mode)) {
    return 0;
  }

  // If the project is a CMAKE project then run pre-install
  // and then read the cmake_install script to run it
  if (!this->InstallProjectViaInstallCMakeProjects(
        setDestDir, bareTempInstallDirectory, default_dir_mode)) {
    return 0;
  }

  if (setDestDir) {
    cmSystemTools::PutEnv("DESTDIR=");
  }

  return res;
}